

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::DuplicateItems(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                 *this,SizeType index1,SizeType index2)

{
  CrtAllocator *pCVar1;
  StringRefType *pSVar2;
  ValueType duplicates;
  Data local_38;
  StringRefType local_28;
  
  local_38.n = (Number)0x0;
  local_38.s.str = (Ch *)0x4000000000000;
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar1;
    this->stateAllocator_ = pCVar1;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_38.s,index1,
             this->stateAllocator_);
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar1;
    this->stateAllocator_ = pCVar1;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_38.s,index2,
             this->stateAllocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->currentError_);
  (this->currentError_).data_.n = (Number)0x0;
  (this->currentError_).data_.s.str = (Ch *)0x0;
  (this->currentError_).data_.f.flags = 3;
  pSVar2 = GetDuplicatesString();
  local_28.s = pSVar2->s;
  local_28.length = pSVar2->length;
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar1;
    this->stateAllocator_ = pCVar1;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_28,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_38.s,
             this->stateAllocator_);
  AddCurrentError(this,kValidateErrorUniqueItems,true);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_38.s);
  return;
}

Assistant:

void DuplicateItems(SizeType index1, SizeType index2) {
        ValueType duplicates(kArrayType);
        duplicates.PushBack(index1, GetStateAllocator());
        duplicates.PushBack(index2, GetStateAllocator());
        currentError_.SetObject();
        currentError_.AddMember(GetDuplicatesString(), duplicates, GetStateAllocator());
        AddCurrentError(kValidateErrorUniqueItems, true);
    }